

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O0

double __thiscall FIR::getBuffer(FIR *this,int i)

{
  int iVar1;
  reference pvVar2;
  int in_ESI;
  FIR *in_RDI;
  double local_8;
  
  iVar1 = getTaps(in_RDI);
  if ((in_ESI < iVar1) && (-1 < in_ESI)) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&in_RDI->buff,(long)in_ESI);
    local_8 = (double)*pvVar2;
  }
  else {
    printf("\nThat value does not exist\n");
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double FIR::getBuffer (int i){
	if (i>= this->getTaps() or i<0) {
	printf("\nThat value does not exist\n");
	return 0.0;
	}else{
	return buff[i];
	}
}